

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O1

void __thiscall HMISong::SetupForHMP(HMISong *this,int len)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  BYTE *pBVar6;
  TrackInfo *pTVar7;
  uint uVar8;
  TrackInfo *pTVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int start;
  int iVar14;
  
  this->ReadVarLen = ReadVarLenHMP;
  pBVar6 = this->MusHeader;
  if (pBVar6[8] == '\0') {
    iVar14 = 0x308;
  }
  else {
    if (*(int *)(pBVar6 + 0xb) != 0x353931 || *(int *)(pBVar6 + 8) != 0x31333130) {
      return;
    }
    iVar14 = 0x388;
  }
  bVar1 = pBVar6[0x30];
  bVar2 = pBVar6[0x31];
  bVar3 = pBVar6[0x32];
  bVar4 = pBVar6[0x33];
  uVar8 = (uint)bVar1 + (uint)bVar2 * 0x100 | (uint)bVar3 * 0x10000 | (uint)bVar4 * 0x1000000;
  this->NumTracks = uVar8;
  if (0 < (int)uVar8) {
    (this->super_MIDIStreamer).Division = *(int *)(pBVar6 + 0x38);
    (this->super_MIDIStreamer).InitialTempo = 1000000;
    pTVar9 = (TrackInfo *)operator_new__((ulong)(uVar8 + 1) * 0x38);
    this->Tracks = pTVar9;
    iVar11 = (uint)bVar1 + (uint)bVar4 * 0x1000000 + (uint)bVar3 * 0x10000 + (uint)bVar2 * 0x100;
    iVar10 = 0;
    do {
      iVar11 = iVar11 + -1;
      iVar12 = iVar14;
      if (iVar14 <= len + -0xc) {
        iVar5 = *(int *)(pBVar6 + (long)iVar14 + 4);
        iVar13 = len - iVar14;
        if (iVar5 < len - iVar14) {
          iVar13 = iVar5;
        }
        iVar12 = iVar5 + iVar14;
        if (0xc < iVar13) {
          pTVar9[iVar10].TrackBegin = pBVar6 + (long)iVar14 + 0xc;
          pTVar9[iVar10].TrackP = 0;
          pTVar9[iVar10].MaxTrackP = (ulong)(iVar13 - 0xc);
          pTVar7 = pTVar9 + iVar10;
          pTVar7->Designation[0] = 0xa000;
          pTVar7->Designation[1] = 0xa00a;
          pTVar7->Designation[2] = 0xa002;
          pTVar7->Designation[3] = 0;
          iVar10 = iVar10 + 1;
        }
      }
    } while ((iVar14 <= len + -0xc) && (iVar14 = iVar12, iVar11 != 0));
    this->NumTracks = iVar10;
  }
  return;
}

Assistant:

void HMISong::SetupForHMP(int len)
{
	int track_data;
	int i, p;

	ReadVarLen = ReadVarLenHMP;
	if (MusHeader[8] == 0)
	{
		track_data = HMP_TRACK_OFFSET_0;
	}
	else if (memcmp(MusHeader + 8, HMP_NEW_DATE, sizeof(HMP_NEW_DATE)) == 0)
	{
		track_data = HMP_TRACK_OFFSET_1;
	}
	else
	{ // unknown HMIMIDIP version
		return;
	}

	NumTracks = GetInt(MusHeader + HMP_TRACK_COUNT_OFFSET);

	if (NumTracks <= 0)
	{
		return;
	}

	// The division is the number of pulses per quarter note (PPQN).
	Division = GetInt(MusHeader + HMP_DIVISION_OFFSET);
	InitialTempo = 1000000;

	Tracks = new TrackInfo[NumTracks + 1];

	// Gather information about each track
	for (i = 0, p = 0; i < NumTracks; ++i)
	{
		int start = track_data;
		int tracklen;

		if (start > len - HMPTRACK_MIDI_DATA_OFFSET)
		{ // Track is incomplete.
			break;
		}

		tracklen = GetInt(MusHeader + start + HMPTRACK_LEN_OFFSET);
		track_data += tracklen;

		// Clamp incomplete tracks to the end of the file.
		tracklen = MIN(tracklen, len - start);
		if (tracklen <= 0)
		{
			continue;
		}

		// Subtract track header size.
		tracklen -= HMPTRACK_MIDI_DATA_OFFSET;
		if (tracklen <= 0)
		{
			continue;
		}

		// Store track information
		Tracks[p].TrackBegin = MusHeader + start + HMPTRACK_MIDI_DATA_OFFSET;
		Tracks[p].TrackP = 0;
		Tracks[p].MaxTrackP = tracklen;

		// Retrieve track designations. We can't check them yet, since we have not yet
		// connected to the MIDI device.
#if 0
		// This is completely a guess based on knowledge of how designations work with
		// HMI files. Some songs contain nothing but zeroes for this data, so I'd rather
		// not go around using it without confirmation.

		Printf("Track %d: %d %08x %d:  \034I", i, GetInt(MusHeader + start),
			GetInt(MusHeader + start + 4), GetInt(MusHeader + start + 8));

		int designations = HMP_DESIGNATIONS_OFFSET +
			GetInt(MusHeader + start + HMPTRACK_DESIGNATION_OFFSET) * 4 * NUM_HMP_DESIGNATIONS;
		for (int ii = 0; ii < NUM_HMP_DESIGNATIONS; ++ii)
		{
			Printf(" %04x", GetInt(MusHeader + designations + ii*4));
		}
		Printf("\n");
#endif
		Tracks[p].Designation[0] = HMI_DEV_GM;
		Tracks[p].Designation[1] = HMI_DEV_GUS;
		Tracks[p].Designation[2] = HMI_DEV_OPL2;
		Tracks[p].Designation[3] = 0;

		p++;
	}

	// In case there were fewer actual chunks in the file than the
	// header specified, update NumTracks with the current value of p.
	NumTracks = p;
}